

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::CumulativeReporterBase
          (CumulativeReporterBase<Catch::JunitReporter> *this,ReporterConfig *_config)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  element_type *peVar4;
  size_type sVar5;
  ReusableStringStream *pRVar6;
  ReporterConfig *in_RSI;
  IStreamingReporter *in_RDI;
  ReporterConfig *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  key_type *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  string *msg;
  
  IStreamingReporter::IStreamingReporter(in_RDI);
  in_RDI->_vptr_IStreamingReporter = (_func_int **)&PTR__CumulativeReporterBase_002f9298;
  ReporterConfig::fullConfig(in_stack_ffffffffffffff08);
  poVar3 = ReporterConfig::stream(in_RSI);
  in_RDI[3]._vptr_IStreamingReporter = (_func_int **)poVar3;
  msg = (string *)(in_RDI + 4);
  clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::vector
            ((vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *)0x168a82);
  clara::std::
  vector<std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>,_std::allocator<std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
  ::vector((vector<std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>,_std::allocator<std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
            *)0x168a95);
  pRVar6 = (ReusableStringStream *)(in_RDI + 10);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  ::vector((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
            *)0x168aa8);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
  ::vector((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
            *)0x168abb);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>_>
  ::vector((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>_>
            *)0x168ace);
  clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
  shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
             0x168ae4);
  clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
  shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
             0x168afa);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::vector((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
            *)0x168b10);
  ReporterPreferences::ReporterPreferences((ReporterPreferences *)(in_RDI + 0x1a));
  *(undefined1 *)&in_RDI[0x1a]._vptr_IStreamingReporter = 0;
  getSupportedVerbosities();
  peVar4 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x168b4a);
  iVar2 = (*(peVar4->super_NonCopyable)._vptr_NonCopyable[0x14])();
  sVar5 = clara::std::
          set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>::
          count((set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
                 *)CONCAT44(iVar2,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18);
  bVar1 = sVar5 != 0 ^ 0xff;
  clara::std::set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  ::~set((set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_> *)
         0x168ba5);
  if ((bVar1 & 1) == 0) {
    return;
  }
  ReusableStringStream::ReusableStringStream(pRVar6);
  pRVar6 = ReusableStringStream::operator<<
                     ((ReusableStringStream *)CONCAT17(bVar1,in_stack_ffffffffffffff10),
                      (char (*) [47])in_stack_ffffffffffffff08);
  ReusableStringStream::str_abi_cxx11_(pRVar6);
  throw_domain_error(msg);
}

Assistant:

CumulativeReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = false;
            if( !DerivedT::getSupportedVerbosities().count( m_config->verbosity() ) )
                CATCH_ERROR( "Verbosity level not supported by this reporter" );
        }